

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

void __thiscall ON_SubD::ClearFragmentColors(ON_SubD *this,bool bClearFragmentColorsMappingTag)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  ON_Color OVar4;
  ON_SubDimple *pOVar5;
  ON_SubDMeshFragment *pOVar6;
  ON_SubDMeshFragmentIterator fragit;
  ON_SubDMeshFragmentIterator local_b0;
  
  pOVar5 = SubDimple(this);
  if (pOVar5 != (ON_SubDimple *)0x0) {
    ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator(&local_b0,this);
    pOVar6 = ON_SubDMeshFragmentIterator::FirstFragment(&local_b0);
    bVar1 = false;
    while (pOVar6 != (ON_SubDMeshFragment *)0x0) {
      bVar2 = bVar1;
      if (!bVar1) {
        bVar2 = true;
        if ((pOVar6->m_vertex_count_etc & 0x1fff) == 0) {
          bVar2 = bVar1;
        }
        if (pOVar6->m_C_stride == 0) {
          bVar2 = bVar1;
        }
        if (pOVar6->m_C == (ON_Color *)0x0) {
          bVar2 = bVar1;
        }
        if ((pOVar6->m_vertex_capacity_etc >> 0xd & 1) == 0) {
          bVar2 = bVar1;
        }
      }
      bVar1 = bVar2;
      pOVar6->m_vertex_capacity_etc = pOVar6->m_vertex_capacity_etc & 0xdfff;
      OVar4 = ON_Color::UnsetColor;
      pOVar6->m_ctrlnetC[0].field_0 = ON_Color::UnsetColor.field_0;
      pOVar6->m_ctrlnetC[1].field_0 = OVar4.field_0;
      pOVar6->m_ctrlnetC[2].field_0 = OVar4.field_0;
      pOVar6->m_ctrlnetC[3].field_0 = OVar4.field_0;
      pOVar6 = ON_SubDMeshFragmentIterator::NextFragment(&local_b0);
    }
    if (bClearFragmentColorsMappingTag) {
      *(undefined4 *)((pOVar5->m_fragment_colors_settings_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar3 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(pOVar5->m_fragment_colors_settings_hash).m_digest =
           ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
      *(undefined8 *)((pOVar5->m_fragment_colors_settings_hash).m_digest + 8) = uVar3;
      pOVar5 = SubDimple(this);
      if (pOVar5 != (ON_SubDimple *)0x0) {
        ON_SubDimple::SetColorsMappingTag(pOVar5,&ON_MappingTag::Unset);
      }
    }
    if (bVar1) {
      ChangeRenderContentSerialNumber(this);
    }
    ON_SubDMeshFragmentIterator::~ON_SubDMeshFragmentIterator(&local_b0);
  }
  return;
}

Assistant:

void ON_SubD::ClearFragmentColors(
  bool bClearFragmentColorsMappingTag
)
{
  const ON_SubDimple* subdimple = this->SubDimple();
  if (nullptr != subdimple)
  {
    bool bFragmentsChanged = false;
    ON_SubDMeshFragmentIterator fragit(*this);
    for (const ON_SubDMeshFragment* frag = fragit.FirstFragment(); nullptr != frag; frag = fragit.NextFragment())
    {
      if (false == bFragmentsChanged && frag->ColorCount() > 0)
        bFragmentsChanged = true;
      frag->SetColorsExistForExperts(false);
    }
    if (bClearFragmentColorsMappingTag)
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(ON_SHA1_Hash::EmptyContentHash);
      this->SetColorsMappingTag(ON_MappingTag::Unset);
    }
    if (bFragmentsChanged)
      this->ChangeRenderContentSerialNumber();
  }
}